

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O3

void __thiscall QCache<QString,_QIcon>::trim(QCache<QString,_QIcon> *this,qsizetype m)

{
  QCache<QString,_QIcon> *__name;
  
  __name = (QCache<QString,_QIcon> *)(this->chain).prev;
  while ((__name != this && (m < this->total))) {
    unlink(this,(char *)__name);
    __name = (QCache<QString,_QIcon> *)(this->chain).prev;
  }
  return;
}

Assistant:

void trim(qsizetype m) noexcept(std::is_nothrow_destructible_v<Node>)
    {
        while (chain.prev != &chain && total > m) {
            Node *n = static_cast<Node *>(chain.prev);
            unlink(n);
        }
    }